

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O2

void CATCH2_INTERNAL_TEST_47(void)

{
  bool bVar1;
  StringRef macroName;
  StringRef capturedExpression;
  tuple<short,_int,_int> local_79c;
  tuple<short,_unsigned_int,_int> local_790;
  int local_784 [3];
  AssertionHandler catchAssertionHandler;
  _Head_base<2ul,std::__cxx11::string,false> local_730 [32];
  undefined4 local_710;
  undefined2 local_70c;
  _Head_base<2ul,std::__cxx11::string,false> local_708 [32];
  undefined4 local_6e8;
  undefined2 local_6e4;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> third
  ;
  tuple<unsigned_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  second;
  undefined1 local_690 [8];
  undefined8 local_688;
  undefined1 local_680 [16];
  undefined8 local_670;
  _Alloc_hider local_668;
  undefined1 local_648 [40];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>
  first;
  undefined1 local_5f8 [40];
  _Head_base<0UL,_short,_false> local_5d0;
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  undefined2 local_588;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_580;
  undefined1 local_538 [40];
  result_t result;
  result_t expectedResult;
  
  first.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>
  .super__Tuple_impl<1UL,_short>.super__Head_base<1UL,_short,_false>._M_head_impl =
       (_Head_base<1UL,_short,_false>)0x2a;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[14]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)
             &first.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ,(char (*) [14])"Hello, World!");
  std::_Head_base<2ul,std::__cxx11::string,false>::_Head_base<char_const(&)[5]>
            ((_Head_base<2ul,std::__cxx11::string,false> *)&second,(char (*) [5])"Test");
  second.
  super__Tuple_impl<0UL,_unsigned_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<1UL,_int,_false>._M_head_impl = -0x2a;
  second.
  super__Tuple_impl<0UL,_unsigned_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._36_4_ = 0x539;
  std::_Head_base<1ul,std::__cxx11::string,false>::_Head_base<char_const(&)[6]>
            ((_Head_base<1ul,std::__cxx11::string,false> *)&third,(char (*) [6])"Test2");
  third.
  super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super__Head_base<0UL,_int,_false>._M_head_impl = -0x539;
  local_538._0_4_ = (_Head_base<2UL,_int,_false>)0xfffffac7;
  local_538._4_4_ = 0x539;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[14]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)(local_538 + 8),
             (char (*) [14])"Hello, World!");
  local_784[2] = 0x539;
  std::_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[14],int,char_const(&)[6],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,std::__cxx11::string> *)
             &catchAssertionHandler,(char (*) [14])"Hello, World!",local_784 + 2,
             (char (*) [6])"Test2");
  local_648._0_4_ = (_Head_base<2UL,_int,_false>)0xfffffac7;
  local_648._4_4_ = -0x2a;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[14]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)(local_648 + 8),
             (char (*) [14])"Hello, World!");
  local_784[1] = 0xffffffd6;
  std::_Tuple_impl<0ul,std::__cxx11::string,int,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[14],int,char_const(&)[6],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,int,std::__cxx11::string> *)local_690,
             (char (*) [14])"Hello, World!",local_784 + 1,(char (*) [6])"Test2");
  local_784[0] = -0x539;
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int>::
  _Tuple_impl<char_const(&)[14],char_const(&)[5],int,void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,int> *)&local_580,
             (char (*) [14])"Hello, World!",(char (*) [5])"Test",local_784);
  std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[14],char_const(&)[5],char_const(&)[6],void>
            ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
             &result,(char (*) [14])"Hello, World!",(char (*) [5])"Test",(char (*) [6])"Test2");
  local_790.super__Tuple_impl<0UL,_short,_unsigned_int,_int>.
  super__Tuple_impl<1UL,_unsigned_int,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = (_Head_base<2UL,_int,_false>)0xfffffac7;
  local_790.super__Tuple_impl<0UL,_short,_unsigned_int,_int>.
  super__Tuple_impl<1UL,_unsigned_int,_int>.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl
       = 0x539;
  local_790.super__Tuple_impl<0UL,_short,_unsigned_int,_int>.super__Head_base<0UL,_short,_false>.
  _M_head_impl = 0x2a;
  std::_Head_base<2ul,std::__cxx11::string,false>::_Head_base<char_const(&)[6]>
            (local_708,(char (*) [6])"Test2");
  local_6e8 = 0x539;
  local_6e4 = 0x2a;
  local_79c.super__Tuple_impl<0UL,_short,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0xfffffac7;
  local_79c.super__Tuple_impl<0UL,_short,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = -0x2a;
  local_79c.super__Tuple_impl<0UL,_short,_int,_int>.super__Head_base<0UL,_short,_false>._M_head_impl
       = 0x2a;
  std::_Head_base<2ul,std::__cxx11::string,false>::_Head_base<char_const(&)[6]>
            (local_730,(char (*) [6])"Test2");
  local_710 = 0xffffffd6;
  local_70c = 0x2a;
  local_5f8._0_4_ = -0x539;
  std::_Head_base<1ul,std::__cxx11::string,false>::_Head_base<char_const(&)[5]>
            ((_Head_base<1ul,std::__cxx11::string,false> *)(local_5f8 + 8),(char (*) [5])"Test");
  local_5d0._M_head_impl = 0x2a;
  std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<char_const(&)[5],char_const(&)[6],void>
            ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)&local_5c8,
             (char (*) [5])"Test",(char (*) [6])"Test2");
  local_588 = 0x2a;
  std::
  _Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Tuple_impl(&expectedResult.
                 super__Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>
                  *)local_538,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&catchAssertionHandler,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                 *)local_648,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_690,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)&local_580,
                (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&result,&local_790,
                (tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_708,&local_79c,
                (tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_730,
                (tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)local_5f8,
                (tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_5c8);
  std::
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&local_5c8);
  std::__cxx11::string::~string((string *)(local_5f8 + 8));
  std::__cxx11::string::~string((string *)local_730);
  std::__cxx11::string::~string((string *)local_708);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&result);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::~_Tuple_impl(&local_580);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_690);
  std::__cxx11::string::~string((string *)(local_648 + 8));
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)(local_538 + 8));
  sl::tuple::detail::
  cartesian_product<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::tuple<unsigned_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            (&result,&first,&second,&third);
  local_690 = (undefined1  [8])0x30509b;
  local_688 = 0x162;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x18;
  capturedExpression.m_start = "result == expectedResult";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_690,capturedExpression,Normal)
  ;
  bVar1 = std::__tuple_compare<$dbf01297$>::__eq(&result,&expectedResult);
  local_688._0_2_ = CONCAT11(bVar1,true);
  local_690 = (undefined1  [8])&PTR_streamReconstructedExpression_003cd768;
  local_680._8_8_ = "==";
  local_670._0_4_ = 2;
  local_670._4_4_ = 0;
  local_680._0_8_ = &result;
  local_668._M_p = (pointer)&expectedResult;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_690);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_690);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::
  _Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl(&result.
                  super__Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
  std::
  _Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Tuple_impl(&expectedResult.
                  super__Tuple_impl<0UL,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_unsigned_int,_int>,_std::tuple<short,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_int,_int>,_std::tuple<short,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::tuple<short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
  std::__cxx11::string::~string((string *)&third);
  std::__cxx11::string::~string((string *)&second);
  std::__cxx11::string::~string
            ((string *)
             &first.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            );
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }